

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::SwapBuffersWithDamageAndBufferAgeTest::iterate
          (SwapBuffersWithDamageAndBufferAgeTest *this)

{
  TestContext *this_00;
  EGLint width_00;
  EGLint height_00;
  deUint32 dVar1;
  deBool dVar2;
  Library *egl_00;
  ostream *poVar3;
  char *description;
  float x_;
  vector<int,_std::allocator<int>_> partialDamageRegion;
  int ndx;
  ostringstream local_228 [8];
  ostringstream stream;
  int endFrameNdx;
  int startFrameNdx;
  int bufferAge;
  vector<int,_std::allocator<int>_> damageRegion;
  int frameNdx;
  int iterationNdx;
  FrameSequence frameSequence;
  undefined1 local_60 [4];
  int numFrames;
  Vec4 clearColor;
  float clearBlue;
  float clearGreen;
  float clearRed;
  int height;
  int width;
  Library *egl;
  Random rnd;
  SwapBuffersWithDamageAndBufferAgeTest *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)&egl,(this->super_SwapBuffersWithDamageTest).m_seed);
  egl_00 = EglTestContext::getLibrary
                     ((this->super_SwapBuffersWithDamageTest).super_TestCase.m_eglTestCtx);
  width_00 = eglu::querySurfaceInt
                       (egl_00,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                        (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3057);
  height_00 = eglu::querySurfaceInt
                        (egl_00,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                         (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3056);
  x_ = de::Random::getFloat((Random *)&egl);
  clearColor.m_data[3] = de::Random::getFloat((Random *)&egl);
  clearColor.m_data[2] = de::Random::getFloat((Random *)&egl);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_60,x_,clearColor.m_data[3],clearColor.m_data[2],1.0);
  frameSequence.
  super__Vector_base<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x18;
  generateFrameSequence
            ((FrameSequence *)&frameNdx,&(this->super_SwapBuffersWithDamageTest).m_frameDrawType,
             (Random *)&egl,0x18,width_00,height_00);
  tcu::TestContext::setTestResult
            ((this->super_SwapBuffersWithDamageTest).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  do {
    (*egl_00->_vptr_Library[0x30])
              (egl_00,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
               (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x3093,0x3095);
    dVar1 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,
                     "surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                     ,0x243);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  if (0 < (this->super_SwapBuffersWithDamageTest).m_iterationTimes) {
    clearColorScreen(&(this->super_SwapBuffersWithDamageTest).m_gl,(Vec4 *)local_60);
    do {
      (*egl_00->_vptr_Library[0x32])
                (egl_00,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                 (this->super_SwapBuffersWithDamageTest).m_eglSurface,0);
      dVar1 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,"swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                       ,0x248);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&startFrameNdx);
    do {
      (*egl_00->_vptr_Library[0x2b])
                (egl_00,(this->super_SwapBuffersWithDamageTest).m_eglDisplay,
                 (this->super_SwapBuffersWithDamageTest).m_eglSurface,0x313d);
      dVar1 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,
                       "querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &bufferAge)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSwapBuffersWithDamageTests.cpp"
                       ,0x251);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    std::__cxx11::ostringstream::ostringstream(local_228);
    poVar3 = std::operator<<((ostream *)local_228,"Fail, the age is invalid. Age: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,-1);
    poVar3 = std::operator<<(poVar3,", frameNdx: ");
    std::ostream::operator<<
              (poVar3,(int)damageRegion.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
    this_00 = (this->super_SwapBuffersWithDamageTest).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx;
    std::__cxx11::ostringstream::str();
    description = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,description);
    std::__cxx11::string::~string((string *)&ndx);
    std::__cxx11::ostringstream::~ostringstream(local_228);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&startFrameNdx);
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
  ::~vector((vector<deqp::egl::(anonymous_namespace)::Frame,_std::allocator<deqp::egl::(anonymous_namespace)::Frame>_>
             *)&frameNdx);
  de::Random::~Random((Random *)&egl);
  return STOP;
}

Assistant:

TestCase::IterateResult SwapBuffersWithDamageAndBufferAgeTest::iterate (void)
{

	de::Random			rnd				(m_seed);
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const int			width			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_WIDTH);
	const int			height			= eglu::querySurfaceInt(egl, m_eglDisplay, m_eglSurface, EGL_HEIGHT);
	const float			clearRed		= rnd.getFloat();
	const float			clearGreen		= rnd.getFloat();
	const float			clearBlue		= rnd.getFloat();
	const tcu::Vec4		clearColor		(clearRed, clearGreen, clearBlue, 1.0f);
	const int			numFrames		= 24; // (width, height) = (480, 480) --> numFrame = 24, divisible
	const FrameSequence frameSequence	= generateFrameSequence(m_frameDrawType, rnd, numFrames, width, height);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	EGLU_CHECK_CALL(egl, surfaceAttrib(m_eglDisplay, m_eglSurface, EGL_SWAP_BEHAVIOR, EGL_BUFFER_DESTROYED));

	for (int iterationNdx = 0; iterationNdx < m_iterationTimes; iterationNdx++)
	{
		clearColorScreen(m_gl, clearColor);
		EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, DE_NULL, 0));

		for (int frameNdx = 0; frameNdx < numFrames; frameNdx++)
		{
			vector<EGLint>	damageRegion;
			int				bufferAge		= -1;
			int				startFrameNdx	= -1;
			int				endFrameNdx		= frameNdx;

			EGLU_CHECK_CALL(egl, querySurface(m_eglDisplay, m_eglSurface, EGL_BUFFER_AGE_EXT, &bufferAge));

			if (bufferAge < 0) // invalid buffer age
			{
				std::ostringstream stream;
				stream << "Fail, the age is invalid. Age: " << bufferAge << ", frameNdx: " << frameNdx;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, stream.str().c_str());
				return STOP;
			}

			if (bufferAge == 0 || bufferAge > frameNdx)
			{
				clearColorScreen(m_gl, clearColor);
				startFrameNdx = 0;
			}
			else
				startFrameNdx = frameNdx-bufferAge+1;

			for (int ndx = startFrameNdx; ndx <= endFrameNdx; ndx++)
			{
				const vector<EGLint> partialDamageRegion = getDamageRegion(frameSequence[ndx]);

				damageRegion.insert(damageRegion.end(), partialDamageRegion.begin(), partialDamageRegion.end());
				m_gles2Renderer->render(width, height, frameSequence[ndx]);
			}

			if (m_resizeType == RESIZETYPE_BEFORE_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}

			EGLU_CHECK_CALL(egl, swapBuffersWithDamageKHR(m_eglDisplay, m_eglSurface, &damageRegion[0], (EGLint)damageRegion.size()/4));

			if (m_resizeType == RESIZETYPE_AFTER_SWAP)
			{
				if (iterationNdx % 2 == 0)
					m_window->setSurfaceSize(IVec2(width*2, height/2));
				else
					m_window->setSurfaceSize(IVec2(height/2, width*2));
			}
		}
	}
	return STOP;
}